

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randunified.cpp
# Opt level: O2

void __thiscall NaRandUnifiedFunc::ddescr_addh(NaRandUnifiedFunc *this,DimDescr *dd)

{
  uint uVar1;
  DimDescr *__src;
  NaReal NVar2;
  NaReal NVar3;
  NaReal NVar4;
  DimDescr *__s;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->n_ddescr;
  this->n_ddescr = uVar1 + 1;
  uVar6 = (ulong)(uVar1 + 1) * 0x28;
  __s = (DimDescr *)operator_new__(uVar6);
  if (uVar1 == 0xffffffff) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    uVar6 = uVar6 - 0x28;
    uVar5 = 0;
    memset(__s,0,(uVar6 - uVar6 % 0x28) + 0x28);
    if (uVar1 != 0) {
      __src = this->ddescr;
      memcpy(__s,__src,(ulong)uVar1 * 0x28);
      uVar5 = (ulong)uVar1;
      if (__src != (DimDescr *)0x0) {
        operator_delete__(__src);
        uVar5 = (ulong)(this->n_ddescr - 1);
      }
    }
  }
  this->ddescr = __s;
  uVar5 = uVar5 & 0xffffffff;
  __s[uVar5].Aprev = dd->Aprev;
  NVar2 = dd->Amin;
  NVar3 = dd->Amax;
  NVar4 = dd->Afirst;
  __s[uVar5].Amaxstep = dd->Amaxstep;
  (&__s[uVar5].Amaxstep)[1] = NVar4;
  __s[uVar5].Amin = NVar2;
  __s[uVar5].Amax = NVar3;
  return;
}

Assistant:

void
NaRandUnifiedFunc::ddescr_addh (const DimDescr& dd)
{
	DimDescr	*pNew = new DimDescr[++n_ddescr];
	if(n_ddescr > 1) {
		memcpy(pNew, ddescr, sizeof(DimDescr) * (n_ddescr - 1));
		delete[] ddescr;
	}
	ddescr = pNew;
	ddescr[n_ddescr - 1] = dd;
}